

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qformlayout.cpp
# Opt level: O0

bool __thiscall
QFormLayoutPrivate::setItem(QFormLayoutPrivate *this,int row,ItemRole role,QLayoutItem *item)

{
  uint uVar1;
  QFormLayoutItem **ppQVar2;
  QFormLayoutItem *this_00;
  long in_RCX;
  uint in_EDX;
  uint in_ESI;
  long in_FS_OFFSET;
  QFormLayoutItem *i;
  int column;
  bool fullRow;
  int in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff5c;
  FixedColumnMatrix<QFormLayoutItem_*,_2> *in_stack_ffffffffffffff60;
  char *in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  uint uVar3;
  bool local_85;
  uint local_84;
  bool local_49;
  char local_48 [32];
  char local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_84 = in_EDX;
  if (in_EDX == 2) {
    local_84 = 1;
  }
  uVar3 = in_ESI;
  uVar1 = QtPrivate::FixedColumnMatrix<QFormLayoutItem_*,_2>::rowCount
                    ((FixedColumnMatrix<QFormLayoutItem_*,_2> *)0x4b5561);
  local_85 = uVar3 < uVar1 && local_84 < 2;
  if (local_85) {
    if (in_RCX == 0) {
      local_49 = false;
    }
    else {
      ppQVar2 = QtPrivate::FixedColumnMatrix<QFormLayoutItem_*,_2>::operator()
                          (in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c,
                           in_stack_ffffffffffffff58);
      if (*ppQVar2 == (QFormLayoutItem *)0x0) {
        this_00 = (QFormLayoutItem *)operator_new(0x40);
        QFormLayoutItem::QFormLayoutItem
                  (this_00,(QLayoutItem *)
                           CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
        this_00->fullRow = in_EDX == 2;
        ppQVar2 = QtPrivate::FixedColumnMatrix<QFormLayoutItem_*,_2>::operator()
                            ((FixedColumnMatrix<QFormLayoutItem_*,_2> *)this_00,
                             in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58);
        *ppQVar2 = this_00;
        QList<QFormLayoutItem_*>::append
                  ((QList<QFormLayoutItem_*> *)0x4b56b0,
                   (parameter_type)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
        local_49 = true;
      }
      else {
        QMessageLogger::QMessageLogger
                  ((QMessageLogger *)CONCAT44(uVar3,in_stack_ffffffffffffff70),
                   in_stack_ffffffffffffff68,(int)((ulong)in_stack_ffffffffffffff60 >> 0x20),
                   (char *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
        QMessageLogger::warning
                  (local_48,"QFormLayoutPrivate::setItem: Cell (%d, %d) already occupied",
                   (ulong)in_ESI,(ulong)local_84);
        local_49 = false;
      }
    }
  }
  else {
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)CONCAT44(uVar3,in_stack_ffffffffffffff70),in_stack_ffffffffffffff68
               ,(int)((ulong)in_stack_ffffffffffffff60 >> 0x20),
               (char *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    QMessageLogger::warning
              (local_28,"QFormLayoutPrivate::setItem: Invalid cell (%d, %d)",(ulong)in_ESI,
               (ulong)local_84);
    local_49 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_49;
  }
  __stack_chk_fail();
}

Assistant:

bool QFormLayoutPrivate::setItem(int row, QFormLayout::ItemRole role, QLayoutItem *item)
{
    const bool fullRow = role == QFormLayout::SpanningRole;
    const int column =  role == QFormLayout::SpanningRole ? 1 : static_cast<int>(role);
    if (Q_UNLIKELY(uint(row) >= uint(m_matrix.rowCount()) || uint(column) > 1U)) {
        qWarning("QFormLayoutPrivate::setItem: Invalid cell (%d, %d)", row, column);
        return false;
    }

    if (!item)
        return false;

    if (Q_UNLIKELY(m_matrix(row, column))) {
        qWarning("QFormLayoutPrivate::setItem: Cell (%d, %d) already occupied", row, column);
        return false;
    }

    QFormLayoutItem *i = new QFormLayoutItem(item);
    i->fullRow = fullRow;
    m_matrix(row, column) = i;

    m_things.append(i);
    return true;
}